

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O1

pair<bool,_QPDFObjectHandle> * __thiscall
qpdf::Array::at(pair<bool,_QPDFObjectHandle> *__return_storage_ptr__,Array *this,int n)

{
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var1;
  pointer pQVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Rb_tree_header *p_Var4;
  QPDF_Array *pQVar5;
  QPDF_Array *pQVar6;
  element_type *peVar7;
  int iVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Base_ptr p_Var9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  _Base_ptr p_Var11;
  
  pQVar5 = array(this);
  if (-1 < n) {
    pQVar6 = array(this);
    _Var1._M_head_impl =
         (pQVar6->sp)._M_t.
         super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
         super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
         super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
    if (_Var1._M_head_impl == (Sparse *)0x0) {
      iVar8 = (int)((ulong)((long)(pQVar6->elements).
                                  super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pQVar6->elements).
                                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    else {
      iVar8 = (_Var1._M_head_impl)->size;
    }
    if (n < iVar8) {
      _Var1._M_head_impl =
           (pQVar5->sp)._M_t.
           super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
           super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
           super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
      if (_Var1._M_head_impl != (Sparse *)0x0) {
        p_Var4 = (_Rb_tree_header *)((long)&(_Var1._M_head_impl)->elements + 8);
        p_Var9 = (_Base_ptr)p_Var4;
        for (p_Var11 = *(_Base_ptr *)((long)&(_Var1._M_head_impl)->elements + 0x10);
            p_Var11 != (_Base_ptr)0x0;
            p_Var11 = *(_Base_ptr *)
                       ((long)&p_Var11->_M_left + (ulong)((int)p_Var11[1]._M_color < n) * 8)) {
          if (n <= (int)p_Var11[1]._M_color) {
            p_Var9 = p_Var11;
          }
        }
        p_Var11 = (_Base_ptr)p_Var4;
        if (((_Rb_tree_header *)p_Var9 != p_Var4) && (p_Var11 = p_Var9, n < (int)p_Var9[1]._M_color)
           ) {
          p_Var11 = (_Base_ptr)p_Var4;
        }
        peVar7 = null_oh.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        _Var10 = null_oh.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        if ((_Rb_tree_header *)p_Var11 != p_Var4) {
          peVar7 = *(element_type **)((long)(p_Var11 + 1) + 8);
          _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         *(_Base_ptr *)((long)(p_Var11 + 1) + 0x10);
        }
        if ((_Base_ptr)_Var10._M_pi != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((_Base_ptr)_Var10._M_pi)->_M_parent =
                 *(int *)&((_Base_ptr)_Var10._M_pi)->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&((_Base_ptr)_Var10._M_pi)->_M_parent =
                 *(int *)&((_Base_ptr)_Var10._M_pi)->_M_parent + 1;
          }
        }
        __return_storage_ptr__->first = true;
        (__return_storage_ptr__->second).super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
        (__return_storage_ptr__->second).super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var10._M_pi;
        return __return_storage_ptr__;
      }
      pQVar2 = (pQVar5->elements).
               super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
               super__Vector_impl_data._M_start;
      __return_storage_ptr__->first = true;
      (__return_storage_ptr__->second).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           pQVar2[(uint)n].super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var3 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&pQVar2[(uint)n].super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi;
      (__return_storage_ptr__->second).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
      if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return __return_storage_ptr__;
      }
      if (__libc_single_threaded != '\0') {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        return __return_storage_ptr__;
      }
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->first = false;
  (__return_storage_ptr__->second).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->second).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, QPDFObjectHandle>
Array::at(int n) const
{
    auto a = array();
    if (n < 0 || n >= size()) {
        return {false, {}};
    }
    if (!a->sp) {
        return {true, a->elements[size_t(n)]};
    }
    auto const& iter = a->sp->elements.find(n);
    return {true, iter == a->sp->elements.end() ? null() : iter->second};
}